

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O0

int socket_errno(void)

{
  int *piVar1;
  
  piVar1 = __errno_location();
  return *piVar1;
}

Assistant:

static int socket_errno(void) {
#ifdef _WINSOCKAPI_
    int err = WSAGetLastError();
    switch(err) {
        case WSAECONNRESET:
            return(ECONNRESET);
        case WSAEINPROGRESS:
            return(EINPROGRESS);
        case WSAEINTR:
            return(EINTR);
        case WSAESHUTDOWN:
            return(ESHUTDOWN);
        case WSAEWOULDBLOCK:
            return(EWOULDBLOCK);
        default:
            return(err);
    }
#else
    return(errno);
#endif
}